

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

int __thiscall CTcSymObjBase::write_to_sym_file(CTcSymObjBase *this,CVmFile *fp)

{
  byte bVar1;
  uint16_t tmp;
  CTPNSuperclass *pCVar2;
  int iVar3;
  char c;
  char b [2];
  char b_1 [2];
  char b_2 [2];
  undefined2 local_2a;
  byte local_27;
  undefined2 local_26;
  undefined2 local_24;
  short local_22;
  
  iVar3 = 0;
  if ((this->field_0xb8 & 0x1d) == 0) {
    local_26 = *(undefined2 *)
                &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry
                 .field_0x24;
    CVmFile::write_bytes(fp,(char *)&local_26,2);
    CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
    local_24 = (undefined2)this->metaclass_;
    CVmFile::write_bytes(fp,(char *)&local_24,2);
    iVar3 = 1;
    if (this->metaclass_ == TC_META_TADSOBJ) {
      bVar1 = (byte)((ushort)*(undefined2 *)&this->field_0xb8 >> 8);
      local_27 = bVar1 >> 1 & 4 | (byte)*(undefined2 *)&this->field_0xb8 >> 4 & 2 | bVar1 >> 2 & 1;
      CVmFile::write_bytes(fp,(char *)&local_27,1);
      local_22 = 0;
      for (pCVar2 = this->sc_name_head_; pCVar2 != (CTPNSuperclass *)0x0; pCVar2 = pCVar2->nxt_) {
        local_22 = local_22 + 1;
      }
      CVmFile::write_bytes(fp,(char *)&local_22,2);
      pCVar2 = this->sc_name_head_;
      if (pCVar2 != (CTPNSuperclass *)0x0) {
        do {
          local_2a = (undefined2)pCVar2->sym_len_;
          CVmFile::write_bytes(fp,(char *)&local_2a,2);
          CVmFile::write_bytes(fp,pCVar2->sym_txt_,pCVar2->sym_len_);
          pCVar2 = pCVar2->nxt_;
        } while (pCVar2 != (CTPNSuperclass *)0x0);
      }
    }
  }
  return iVar3;
}

Assistant:

int CTcSymObjBase::write_to_sym_file(CVmFile *fp)
{
    int result;

    /* 
     *   If we're external, don't bother writing to the file - if we're
     *   importing an object, we don't want to export it as well.  If it's
     *   modified, don't write it either, because modified symbols cannot be
     *   referenced directly by name (the symbol for a modified object is a
     *   fake symbol anyway).  In addition, don't write the symbol if it's a
     *   'modify' or 'replace' definition that applies to an external base
     *   object - instead, we'll pick up the symbol from the other symbol
     *   file with the original definition.  
     */
    if (is_extern_ || modified_ || ext_modify_ || ext_replace_)
        return FALSE;

    /* inherit default */
    result =  CTcSymbol::write_to_sym_file(fp);

    /* if that was successful, write additional object-type-specific data */
    if (result)
    {
        /* write the metaclass ID */
        fp->write_uint2((int)metaclass_);

        /* if it's of metaclass tads-object, write superclass information */
        if (metaclass_ == TC_META_TADSOBJ)
        {
            char c;
            size_t cnt;
            CTPNSuperclass *sc;

            /* 
             *   set up our flags: indicate whether or not we're explicitly
             *   based on the root object class, and if we're a 'class'
             *   object 
             */
            c = ((sc_is_root() ? 1 : 0)
                 | (is_class() ? 2 : 0)
                 | (is_transient() ? 4 : 0));
            fp->write_bytes(&c, 1);

            /* count the declared superclasses */
            for (cnt = 0, sc = sc_name_head_ ; sc != 0 ;
                 sc = sc->nxt_, ++cnt) ;

            /* 
             *   write the number of declared superclasses followed by the
             *   names of the superclasses 
             */
            fp->write_uint2(cnt);
            for (sc = sc_name_head_ ; sc != 0 ; sc = sc->nxt_)
            {
                /* write the counted-length identifier */
                fp->write_uint2(sc->get_sym_len());
                fp->write_bytes(sc->get_sym_txt(), sc->get_sym_len());
            }
        }
    }

    /* return the result */
    return result;
}